

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O0

void __thiscall bandit::reporter::xunit::it_failed(xunit *this,string *desc,assertion_exception *ex)

{
  failure_formatter_t *pfVar1;
  ostream *poVar2;
  string local_60;
  string local_40;
  assertion_exception *local_20;
  assertion_exception *ex_local;
  string *desc_local;
  xunit *this_local;
  
  local_20 = ex;
  ex_local = (assertion_exception *)desc;
  desc_local = (string *)this;
  progress_base::it_failed(&this->super_progress_base,desc,ex);
  print_remaining_header_with_time(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"\t\t<failure message=\"");
  pfVar1 = (this->super_progress_base).failure_formatter_;
  (*pfVar1->_vptr_interface[2])(&local_60,pfVar1,local_20);
  escape(&local_40,this,&local_60);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,"\" />\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<((ostream *)&this->field_0x80,"\t</testcase>\n");
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        progress_base::it_failed(desc, ex);
        print_remaining_header_with_time();
        work_stm_ << "\t\t<failure message=\"" << escape(failure_formatter_.format(ex)) << "\" />\n";
        work_stm_ << "\t</testcase>\n";
      }